

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O3

void InitLeft(VP8EncIterator *it)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  
  uVar1 = (0 < it->y_) * '\x02' + '\x7f';
  it->v_left_[-1] = uVar1;
  it->u_left_[-1] = uVar1;
  it->y_left_[-1] = uVar1;
  puVar2 = it->y_left_;
  puVar2[0] = 0x81;
  puVar2[1] = 0x81;
  puVar2[2] = 0x81;
  puVar2[3] = 0x81;
  puVar2[4] = 0x81;
  puVar2[5] = 0x81;
  puVar2[6] = 0x81;
  puVar2[7] = 0x81;
  puVar2[8] = 0x81;
  puVar2[9] = 0x81;
  puVar2[10] = 0x81;
  puVar2[0xb] = 0x81;
  puVar2[0xc] = 0x81;
  puVar2[0xd] = 0x81;
  puVar2[0xe] = 0x81;
  puVar2[0xf] = 0x81;
  puVar2 = it->u_left_;
  puVar2[0] = 0x81;
  puVar2[1] = 0x81;
  puVar2[2] = 0x81;
  puVar2[3] = 0x81;
  puVar2[4] = 0x81;
  puVar2[5] = 0x81;
  puVar2[6] = 0x81;
  puVar2[7] = 0x81;
  puVar2 = it->v_left_;
  puVar2[0] = 0x81;
  puVar2[1] = 0x81;
  puVar2[2] = 0x81;
  puVar2[3] = 0x81;
  puVar2[4] = 0x81;
  puVar2[5] = 0x81;
  puVar2[6] = 0x81;
  puVar2[7] = 0x81;
  it->left_nz_[8] = 0;
  if (it->top_derr_ != (DError *)0x0) {
    *(int8_t *)((long)(it->left_derr_ + 0) + 0) = '\0';
    *(int8_t *)((long)(it->left_derr_ + 0) + 1) = '\0';
    *(int8_t *)((long)(it->left_derr_ + 1) + 0) = '\0';
    *(int8_t *)((long)(it->left_derr_ + 1) + 1) = '\0';
  }
  return;
}

Assistant:

static void InitLeft(VP8EncIterator* const it) {
  it->y_left_[-1] = it->u_left_[-1] = it->v_left_[-1] =
      (it->y_ > 0) ? 129 : 127;
  memset(it->y_left_, 129, 16);
  memset(it->u_left_, 129, 8);
  memset(it->v_left_, 129, 8);
  it->left_nz_[8] = 0;
  if (it->top_derr_ != NULL) {
    memset(&it->left_derr_, 0, sizeof(it->left_derr_));
  }
}